

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O2

ssize_t __thiscall
xercesc_4_0::XSerializeEngine::read(XSerializeEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  void *extraout_RAX;
  void *pvVar1;
  undefined4 in_register_00000034;
  void *ptr;
  XMLByte *__n;
  XMLByte *pXVar2;
  
  ptr = (void *)CONCAT44(in_register_00000034,__fd);
  ensureLoading(this);
  ensurePointer(this,ptr);
  ensureLoadBuffer(this);
  pvVar1 = extraout_RAX;
  if (__buf != (void *)0x0) {
    pXVar2 = this->fBufCur;
    __n = this->fBufLoadMax + -(long)pXVar2;
    if (__buf < __n || (void *)((long)__buf - (long)__n) == (void *)0x0) {
      pvVar1 = memcpy(ptr,pXVar2,(size_t)__buf);
    }
    else {
      memcpy(ptr,pXVar2,(size_t)__n);
      pXVar2 = (XMLByte *)((long)ptr + (long)__n);
      pvVar1 = (void *)this->fBufSize;
      for (__buf = (void *)((long)__buf - (long)__n); pvVar1 <= __buf;
          __buf = (void *)((long)__buf - (long)pvVar1)) {
        fillBuffer(this);
        memcpy(pXVar2,this->fBufCur,this->fBufSize);
        pvVar1 = (void *)this->fBufSize;
        pXVar2 = pXVar2 + (long)pvVar1;
      }
      if (__buf == (void *)0x0) {
        return (ssize_t)pvVar1;
      }
      fillBuffer(this);
      pvVar1 = memcpy(pXVar2,this->fBufCur,(size_t)__buf);
    }
    this->fBufCur = this->fBufCur + (long)__buf;
  }
  return (ssize_t)pvVar1;
}

Assistant:

void XSerializeEngine::read(XMLByte* const toRead
                          , XMLSize_t      readLen)
{
    ensureLoading();
    ensurePointer(toRead);
    ensureLoadBuffer();

    if (readLen == 0)
        return;

    /***
     *  If unread is sufficient, read it up
     ***/
    XMLSize_t dataAvail = fBufLoadMax - fBufCur;

    if (readLen <= dataAvail)
    {
        memcpy(toRead, fBufCur, readLen);
        fBufCur += readLen;
        return;
    }

    /***
     *
     * fillBuffer will discard anything left in the buffer
     * before it asks the inputStream to fill in the buffer,
     * so we need to readup everything in the buffer before
     * calling fillBuffer
     *
     ***/
    XMLByte*     tempRead   = (XMLByte*) toRead;
    XMLSize_t    readRemain = readLen;

    // read the unread
    memcpy(tempRead, fBufCur, dataAvail);
    tempRead   += dataAvail;
    readRemain -= dataAvail;

    // read chunks of fBufSize
    while (readRemain >= fBufSize)
    {
        fillBuffer();
        memcpy(tempRead, fBufCur, fBufSize);
        tempRead   += fBufSize;
        readRemain -= fBufSize;
    }

    // read the remaining if any
    if (readRemain)
    {
        fillBuffer();
        memcpy(tempRead, fBufCur, readRemain);
        fBufCur += readRemain;
    }

}